

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.hpp
# Opt level: O0

string * CLI::Timer::Simple(string *__return_storage_ptr__,string *title,string *time)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  string *local_20;
  string *time_local;
  string *title_local;
  
  local_20 = time;
  time_local = title;
  title_local = __return_storage_ptr__;
  ::std::operator+(&local_40,title,": ");
  ::std::operator+(__return_storage_ptr__,&local_40,time);
  ::std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

static std::string Simple(std::string title, std::string time) { return title + ": " + time; }